

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TuningsImpl.h
# Opt level: O0

double Tunings::locale_atof(char *s)

{
  double dVar1;
  locale local_1e0 [8];
  locale local_1d8 [31];
  allocator local_1b9;
  string local_1b8 [32];
  istringstream local_198 [8];
  istringstream istr;
  double local_18;
  double result;
  char *s_local;
  
  local_18 = 0.0;
  result = (double)s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,s,&local_1b9);
  std::__cxx11::istringstream::istringstream(local_198,local_1b8,8);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::locale::locale(local_1e0,"C");
  std::ios::imbue(local_1d8);
  std::locale::~locale(local_1d8);
  std::locale::~locale(local_1e0);
  std::istream::operator>>((istream *)local_198,&local_18);
  dVar1 = local_18;
  std::__cxx11::istringstream::~istringstream(local_198);
  return dVar1;
}

Assistant:

inline double locale_atof(const char *s)
{
    double result = 0;
    std::istringstream istr(s);
    istr.imbue(std::locale("C"));
    istr >> result;
    return result;
}